

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderFrame(ImVec2 p_min,ImVec2 p_max,ImU32 fill_col,bool border,float rounding)

{
  undefined1 in_SIL;
  undefined4 in_EDI;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  int in_XMM2_Da;
  float border_size;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff48;
  ImVec2 *this;
  ImDrawCornerFlags in_stack_ffffffffffffff54;
  float _x;
  undefined8 in_stack_ffffffffffffff58;
  ImVec2 *in_stack_ffffffffffffff60;
  ImDrawList *pIVar1;
  ImVec2 *in_stack_ffffffffffffff68;
  ImVec2 local_74;
  ImVec2 local_6c;
  ImVec2 local_64;
  ImVec2 local_5c;
  float local_54;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_38;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  int in_stack_ffffffffffffffe0;
  undefined3 in_stack_ffffffffffffffe8;
  uint uVar4;
  ImDrawList *this_00;
  
  this_00 = (ImDrawList *)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  uVar4 = CONCAT13(in_SIL,in_stack_ffffffffffffffe8) & 0x1ffffff;
  pIVar2 = GImGui->CurrentWindow;
  pIVar1 = (ImDrawList *)&stack0xffffffffffffffc0;
  pIVar3 = GImGui;
  ImVec2::ImVec2((ImVec2 *)pIVar1,1.0,0.0);
  local_38 = operator+(in_stack_ffffffffffffff48,(ImVec2 *)0x12b9ea);
  ImVec2::ImVec2(&local_50,0.1,0.1);
  local_48 = operator-(in_stack_ffffffffffffff48,(ImVec2 *)0x12ba43);
  ImDrawList::AddRectFilled
            (pIVar1,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             (ImU32)((ulong)in_stack_ffffffffffffff58 >> 0x20),(float)in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff54);
  local_54 = (pIVar3->Style).FrameBorderSize;
  if (((uVar4 & 0x1000000) != 0) && (0.0 < local_54)) {
    pIVar1 = pIVar2->DrawList;
    this = &local_64;
    _x = 1.0;
    ImVec2::ImVec2(this,1.0,1.0);
    local_5c = operator+(this,(ImVec2 *)0x12baf0);
    ImVec2::ImVec2(&local_74,_x,_x);
    local_6c = operator+(this,(ImVec2 *)0x12bb20);
    GetColorU32((ImGuiCol)((ulong)pIVar1 >> 0x20),SUB84(pIVar1,0));
    ImDrawList::AddRect(this_00,(ImVec2 *)CONCAT44(in_EDI,uVar4),
                        (ImVec2 *)CONCAT44(in_XMM2_Da,in_stack_ffffffffffffffe0),
                        (ImU32)((ulong)pIVar3 >> 0x20),SUB84(pIVar3,0),
                        (ImDrawCornerFlags)((ulong)pIVar2 >> 0x20),SUB84(pIVar2,0));
    GetColorU32((ImGuiCol)((ulong)pIVar1 >> 0x20),SUB84(pIVar1,0));
    ImDrawList::AddRect(this_00,(ImVec2 *)CONCAT44(in_EDI,uVar4),
                        (ImVec2 *)CONCAT44(in_XMM2_Da,in_stack_ffffffffffffffe0),
                        (ImU32)((ulong)pIVar3 >> 0x20),SUB84(pIVar3,0),
                        (ImDrawCornerFlags)((ulong)pIVar2 >> 0x20),SUB84(pIVar2,0));
  }
  return;
}

Assistant:

void ImGui::RenderFrame(ImVec2 p_min, ImVec2 p_max, ImU32 fill_col, bool border, float rounding)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    //window->DrawList->AddRectFilled(p_min, p_max, fill_col, rounding);
    p_min = p_min + ImVec2(1.0, 0.0);
    window->DrawList->AddRectFilled(p_min, p_max-ImVec2(+0.1,0.1), fill_col, rounding);
    const float border_size = g.Style.FrameBorderSize;
    if (border && border_size > 0.0f)
    {
        window->DrawList->AddRect(p_min + ImVec2(1, 1), p_max + ImVec2(1, 1), GetColorU32(ImGuiCol_BorderShadow), rounding, ImDrawCornerFlags_All, border_size);
        window->DrawList->AddRect(p_min, p_max, GetColorU32(ImGuiCol_Border), rounding, ImDrawCornerFlags_All, border_size);
    }
}